

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaoSolver.cpp
# Opt level: O0

bool __thiscall BaoSolver::checkIfConnect(BaoSolver *this,int v,uint32_t s)

{
  bool bVar1;
  reference pvVar2;
  int local_84;
  bool local_7d;
  int i_1;
  value_type vStack_78;
  bool flag;
  int i;
  int tt;
  undefined1 local_68 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  uint32_t s_local;
  int v_local;
  BaoSolver *this_local;
  
  q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_node.
  _0_4_ = s;
  q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_node.
  _4_4_ = v;
  memset(this->dis,0,0xa0);
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)local_68);
  while (bVar1 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                           ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
  }
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68,
             (value_type *)
             ((long)&q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
                     ._M_finish._M_node + 4));
  this->dis[q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_node._4_4_] = 1;
  while (bVar1 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                           ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                       ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
    vStack_78 = *pvVar2;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
    for (i_1 = 0; i_1 < this->n; i_1 = i_1 + 1) {
      if (((this->edge[vStack_78][i_1] != 0) &&
          (((uint32_t)
            q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_node >> ((byte)i_1 & 0x1f) & 1) != 0)) && (this->dis[i_1] != 1)) {
        this->dis[i_1] = 1;
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68,&i_1);
      }
    }
  }
  local_7d = true;
  for (local_84 = 0; local_84 < this->n; local_84 = local_84 + 1) {
    if (((uint32_t)
         q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
         _M_node >> ((byte)local_84 & 0x1f) & 1) != 0) {
      local_7d = ((uint)local_7d & this->dis[local_84]) != 0;
    }
  }
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_68);
  return local_7d;
}

Assistant:

bool BaoSolver::checkIfConnect(int v, uint32_t s) {
    memset(dis, 0, sizeof(dis));
    queue <int> q;
    while(!q.empty()) q.pop();
    q.push(v); dis[v] = 1;
    while(!q.empty()) {
        int tt = q.front(); q.pop();
        for (int i = 0; i < n; i++) if (edge[tt][i] && ((s >> i) & 1)) {
            if (dis[i] != 1) {
                dis[i] = 1;
                q.push(i);
            }
        }
    }
    bool flag = true;
    for (int i = 0; i < n; i++) if ((s >> i) & 1) {
        flag &= dis[i];
    }
    return flag;
}